

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O0

int ndn_lite_default_aes_cbc_encrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  long lVar1;
  long lVar2;
  uint8_t *in;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t auStack_130 [8];
  uint8_t auStack_128 [8];
  uint8_t *local_120;
  uint8_t *local_118;
  undefined1 local_110 [8];
  tc_aes_key_sched_struct schedule;
  unsigned_long __vla_expr1;
  int err_or_size;
  unsigned_long __vla_expr0;
  abstract_aes_key *aes_key_local;
  uint8_t *aes_iv_local;
  uint32_t *output_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (aes_key->key_size < 0x10) {
    input_value_local._4_4_ = 0xffffffe5;
  }
  else {
    lVar1 = -((ulong)(input_size + 0x10) + 0xf & 0xfffffffffffffff0);
    puVar4 = auStack_128 + lVar1;
    puVar5 = auStack_130 + lVar1;
    local_118 = puVar4;
    puVar5[0] = 0xa6;
    puVar5[1] = '\x19';
    puVar5[2] = '\x12';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    input_value_local._4_4_ =
         _pkcs7_padding(input_value,(uint8_t)input_size,puVar4,(uint8_t)(input_size + 0x10));
    if (-1 < (int)input_value_local._4_4_) {
      schedule.words._168_8_ = ZEXT48(input_value_local._4_4_ + 0x10);
      lVar2 = -(schedule.words._168_8_ + 0xf & 0xfffffffffffffff0);
      puVar4 = puVar4 + lVar2;
      local_120 = puVar4;
      puVar4[-8] = 0xf6;
      puVar4[-7] = '\x19';
      puVar4[-6] = '\x12';
      puVar4[-5] = '\0';
      puVar4[-4] = '\0';
      puVar4[-3] = '\0';
      puVar4[-2] = '\0';
      puVar4[-1] = '\0';
      iVar3 = tc_aes128_set_encrypt_key((TCAesKeySched_t)local_110,aes_key->key_value);
      in = local_118;
      puVar6 = local_120;
      if (iVar3 == 1) {
        builtin_memcpy(auStack_128 + lVar2 + lVar1 + -8,"2\x1a\x12",4);
        puVar4[-4] = '\0';
        puVar4[-3] = '\0';
        puVar4[-2] = '\0';
        puVar4[-1] = '\0';
        iVar3 = tc_cbc_mode_encrypt(puVar6,input_value_local._4_4_ + 0x10,in,input_value_local._4_4_
                                    ,aes_iv,(TCAesKeySched_t)local_110);
        if (iVar3 == 1) {
          puVar6 = local_120 + 0x10;
          builtin_memcpy(auStack_128 + lVar2 + lVar1 + -8,"_\x1a\x12",4);
          puVar4[-4] = '\0';
          puVar4[-3] = '\0';
          puVar4[-2] = '\0';
          puVar4[-1] = '\0';
          memcpy(output_value,puVar6,(long)(int)input_value_local._4_4_);
          *output_size = input_value_local._4_4_;
          input_value_local._4_4_ = 0;
        }
        else {
          input_value_local._4_4_ = 0xffffffe7;
        }
      }
      else {
        input_value_local._4_4_ = 0xffffffe4;
      }
    }
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_lite_default_aes_cbc_encrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  // TODO: too much memory usage when encrypt large chunks
  uint8_t final_input[input_size + TC_AES_BLOCK_SIZE];
  int err_or_size = _pkcs7_padding(input_value, input_size, final_input, sizeof(final_input));
  if (err_or_size < 0)
    return err_or_size;
  uint8_t output[err_or_size + TC_AES_BLOCK_SIZE];
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_encrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt will prepend IV to the output
  if (tc_cbc_mode_encrypt(output, err_or_size + TC_AES_BLOCK_SIZE,
                          final_input, err_or_size, aes_iv, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  memcpy(output_value, output + TC_AES_BLOCK_SIZE, err_or_size);
  *output_size = err_or_size;
  return NDN_SUCCESS;
}